

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void * make_block_array(void *mem,int count,int size)

{
  undefined8 local_30;
  char *q;
  void **p;
  int i;
  int size_local;
  int count_local;
  void *mem_local;
  
  local_30 = (void *)((long)mem + (long)count * 8);
  for (p._4_4_ = 0; p._4_4_ < count; p._4_4_ = p._4_4_ + 1) {
    *(void **)((long)mem + (long)p._4_4_ * 8) = local_30;
    local_30 = (void *)((long)local_30 + (long)size);
  }
  return mem;
}

Assistant:

static void *make_block_array(void *mem, int count, int size)
{
   int i;
   void ** p = (void **) mem;
   char *q = (char *) (p + count);
   for (i=0; i < count; ++i) {
      p[i] = q;
      q += size;
   }
   return p;
}